

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateProfiledNewScArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef,uint32 length)

{
  Func *func;
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  BOOL BVar2;
  RegOpnd *pRVar3;
  RegOpnd *pRVar4;
  AddrOpnd *pAVar5;
  Opnd *pOVar6;
  LabelInstr *target;
  ArrayCallSiteInfo *arrayInfo_00;
  ArrayCallSiteInfo *arrayInfo_01;
  int iVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_68 [4];
  AutoReuseOpnd autoReuseHeadOpnd;
  uint32 local_38;
  bool local_31;
  uint32 size;
  bool isZeroed;
  
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ArrayCtorFastPathPhase,sourceContextId,functionId);
  if ((bVar1) || (DAT_0143bfb9 != '\0')) {
LAB_00563e97:
    bVar1 = false;
  }
  else {
    func = this->m_func;
    autoReuseHeadOpnd._16_8_ = IR::LabelInstr::New(Label,func,true);
    local_38 = length;
    pRVar3 = IR::Opnd::AsRegOpnd(instr->m_dst);
    if (instr->m_dst == (Opnd *)0x0) {
LAB_0056408f:
      BVar2 = IsSmallObject<Js::JavascriptArray>(this,length);
      if (BVar2 == 0) goto LAB_00563e97;
      pRVar3 = GenerateArrayLiteralsAlloc<Js::JavascriptArray>
                         (this,instr,&local_38,arrayInfo,&local_31);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&local_68[0].field_0,&pRVar3->super_Opnd,func,true);
      iVar7 = length * 8 + 0x18;
      for (; length < local_38; length = length + 1) {
        pOVar6 = GetMissingItemOpnd(TyVar,this->m_func);
        GenerateMemInit(this,pRVar3,iVar7,pOVar6,instr,false);
        iVar7 = iVar7 + 8;
      }
    }
    else {
      local_68[0] = (instr->m_dst->m_valueType).field_0;
      bVar1 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_68[0].field_0);
      if (!bVar1) {
        if (instr->m_dst != (Opnd *)0x0) {
          local_68[0] = (instr->m_dst->m_valueType).field_0;
          bVar1 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_68[0].field_0);
          if (bVar1) {
            BVar2 = IsSmallObject<Js::JavascriptNativeFloatArray>(this,length);
            if (BVar2 != 0) {
              GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                        (this,instr,arrayInfo_01,arrayInfoAddr,
                         (LabelInstr *)autoReuseHeadOpnd._16_8_);
              pRVar4 = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>
                                 (this,instr,&local_38,arrayInfo,&local_31);
              IR::AutoReuseOpnd::AutoReuseOpnd
                        ((AutoReuseOpnd *)&local_68[0].field_0,&pRVar4->super_Opnd,func,true);
              pAVar5 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,
                                         this->m_func,false,(Var)0x0);
              GenerateMemInit(this,pRVar3,0x38,&pAVar5->super_Opnd,instr,false);
              iVar7 = length * 8 + 0x18;
              for (; length < local_38; length = length + 1) {
                pOVar6 = GetMissingItemOpndForAssignment(TyFloat64,this->m_func);
                GenerateMemInit(this,pRVar4,iVar7,pOVar6,instr,false);
                iVar7 = iVar7 + 8;
              }
              goto LAB_0056410a;
            }
            goto LAB_00563e97;
          }
        }
        goto LAB_0056408f;
      }
      BVar2 = IsSmallObject<Js::JavascriptNativeIntArray>(this,length);
      if (BVar2 == 0) goto LAB_00563e97;
      GenerateArrayInfoIsNativeIntArrayTest
                (this,instr,arrayInfo_00,arrayInfoAddr,(LabelInstr *)autoReuseHeadOpnd._16_8_);
      pRVar4 = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>
                         (this,instr,&local_38,arrayInfo,&local_31);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&local_68[0].field_0,&pRVar4->super_Opnd,func,true);
      pAVar5 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                 false,(Var)0x0);
      GenerateMemInit(this,pRVar3,0x38,&pAVar5->super_Opnd,instr,false);
      iVar7 = length * 4 + 0x18;
      for (; length < local_38; length = length + 1) {
        GenerateMemInit(this,pRVar4,iVar7,-0x7fffe,instr,local_31);
        iVar7 = iVar7 + 4;
      }
    }
LAB_0056410a:
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&local_68[0].field_0);
    target = IR::LabelInstr::New(Label,func,false);
    InsertBranch(Br,target,instr);
    IR::Instr::InsertBefore(instr,(Instr *)autoReuseHeadOpnd._16_8_);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
Lowerer::GenerateProfiledNewScArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef, uint32 length)
{
    if (PHASE_OFF(Js::ArrayCtorFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return false;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    uint32 size = length;
    bool isZeroed;
    IR::RegOpnd *dstOpnd = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *headOpnd;
    uint32 i = length;

    if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeIntArray())
    {
        if (!IsSmallObject<Js::JavascriptNativeIntArray>(length))
        {
            return false;
        }
        GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        for (; i < size; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                Js::JavascriptNativeIntArray::MissingItem, instr, isZeroed);
        }
    }
    else if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeFloatArray())
    {
        if (!IsSmallObject<Js::JavascriptNativeFloatArray>(length))
        {
            return false;
        }
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        for (; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(double),
                GetMissingItemOpndForAssignment(TyFloat64, m_func),
                instr, isZeroed);
        }
    }
    else
    {
        if (!IsSmallObject<Js::JavascriptArray>(length))
        {
            return false;
        }
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);
        for (; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(Js::Var),
                GetMissingItemOpndForAssignment(TyVar, m_func),
                instr, isZeroed);
        }
    }

    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
    return true;
}